

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall ON_DimStyle::SetDrawTextMask(ON_DimStyle *this,bool bDraw)

{
  undefined8 uVar1;
  MaskType MVar2;
  MaskFrame MVar3;
  uchar uVar5;
  ON_Color OVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined8 uVar16;
  ON_TextMask text_mask;
  ON_TextMask local_38;
  undefined6 uVar4;
  undefined5 uVar6;
  undefined4 uVar10;
  undefined3 uVar12;
  undefined2 uVar14;
  
  local_38.m_bDrawMask = (this->m_text_mask).m_bDrawMask;
  MVar2 = (this->m_text_mask).m_mask_type;
  MVar3 = (this->m_text_mask).m_mask_frame;
  uVar5 = (this->m_text_mask).m_reserved2;
  OVar7.field_0 = (this->m_text_mask).m_mask_color.field_0;
  uVar6 = CONCAT41(OVar7.field_0,uVar5);
  uVar4 = CONCAT51(uVar6,MVar3);
  local_38._1_7_ = CONCAT61(uVar4,MVar2);
  local_38.m_mask_border = (this->m_text_mask).m_mask_border;
  uVar8 = (this->m_text_mask).m_reserved3;
  uVar9 = (this->m_text_mask).m_content_hash.m_digest[0];
  uVar11 = (this->m_text_mask).m_content_hash.m_digest[1];
  uVar13 = (this->m_text_mask).m_content_hash.m_digest[2];
  uVar15 = (this->m_text_mask).m_content_hash.m_digest[3];
  uVar14 = CONCAT11(uVar15,uVar13);
  uVar12 = CONCAT21(uVar14,uVar11);
  uVar10 = CONCAT31(uVar12,uVar9);
  uVar16 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4);
  uVar1 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc);
  local_38.m_content_hash.m_digest._12_4_ = SUB84(uVar1,0);
  local_38.m_content_hash.m_digest._16_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  local_38.m_content_hash.m_digest._4_4_ = SUB84(uVar16,0);
  local_38.m_content_hash.m_digest._8_4_ = SUB84((ulong)uVar16 >> 0x20,0);
  local_38.m_content_hash.m_digest._0_4_ = uVar10;
  if (local_38.m_bDrawMask != bDraw) {
    local_38.m_bDrawMask = bDraw;
    local_38.m_content_hash.m_digest._0_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._0_4_;
    local_38.m_content_hash.m_digest._4_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._4_4_;
    local_38.m_content_hash.m_digest._8_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._8_4_;
    local_38.m_content_hash.m_digest._12_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._12_4_;
    local_38.m_content_hash.m_digest._16_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  }
  local_38.m_reserved3 = uVar8;
  Internal_SetTextMask(this,&local_38);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,DrawMask);
  return;
}

Assistant:

void ON_DimStyle::SetDrawTextMask(bool bDraw)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetDrawTextMask(bDraw);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::DrawMask);
}